

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_button_behavior(nk_flags *state,nk_rect r,nk_input *i,nk_button_behavior behavior)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  *state = *state & 2 | 4;
  if (i == (nk_input *)0x0) {
    return 0;
  }
  fVar1 = (i->mouse).pos.x;
  uVar3 = 0;
  fVar5 = r.x;
  fVar8 = r.w + fVar5;
  fVar7 = r.h;
  fVar6 = r.y;
  uVar2 = 0;
  if ((((fVar5 <= fVar1) && (uVar2 = 0, fVar1 < fVar8)) &&
      (fVar1 = (i->mouse).pos.y, uVar2 = 0, fVar6 <= fVar1)) &&
     (uVar2 = uVar3, fVar1 < fVar6 + fVar7)) {
    *state = 0x12;
    *state = (uint)((i->mouse).buttons[0].down != 0) * 0x10 + 0x12;
    fVar1 = (i->mouse).buttons[0].clicked_pos.x;
    if ((((fVar5 <= fVar1) && (fVar1 < fVar8)) &&
        ((fVar1 = (i->mouse).buttons[0].clicked_pos.y, fVar6 <= fVar1 &&
         ((fVar1 < fVar6 + fVar7 &&
          (uVar2 = (i->mouse).buttons[0].down, behavior == NK_BUTTON_DEFAULT)))))) &&
       (bVar4 = uVar2 == 0, uVar2 = uVar3, bVar4)) {
      uVar2 = (uint)((i->mouse).buttons[0].clicked != 0);
    }
  }
  if ((*state & 0x10) != 0) {
    fVar1 = (i->mouse).prev.x;
    uVar3 = 8;
    if ((((fVar1 < fVar5) || (fVar8 <= fVar1)) || (fVar1 = (i->mouse).prev.y, fVar1 < fVar6)) ||
       (fVar6 + fVar7 <= fVar1)) goto LAB_0013d4d3;
  }
  fVar1 = (i->mouse).prev.x;
  if (((fVar1 < fVar5) || (fVar8 <= fVar1)) ||
     ((fVar1 = (i->mouse).prev.y, fVar1 < fVar6 || (uVar3 = 0x40, fVar6 + fVar7 <= fVar1)))) {
    return uVar2;
  }
LAB_0013d4d3:
  *state = *state | uVar3;
  return uVar2;
}

Assistant:

NK_INTERN int
nk_button_behavior(nk_flags *state, struct nk_rect r,
    const struct nk_input *i, enum nk_button_behavior behavior)
{
    int ret = 0;
    nk_widget_state_reset(state);
    if (!i) return 0;
    if (nk_input_is_mouse_hovering_rect(i, r)) {
        *state = NK_WIDGET_STATE_HOVERED;
        if (nk_input_is_mouse_down(i, NK_BUTTON_LEFT))
            *state = NK_WIDGET_STATE_ACTIVE;
        if (nk_input_has_mouse_click_in_rect(i, NK_BUTTON_LEFT, r)) {
            ret = (behavior != NK_BUTTON_DEFAULT) ?
                nk_input_is_mouse_down(i, NK_BUTTON_LEFT):
#ifdef NK_BUTTON_TRIGGER_ON_RELEASE
                nk_input_is_mouse_released(i, NK_BUTTON_LEFT);
#else
                nk_input_is_mouse_pressed(i, NK_BUTTON_LEFT);
#endif
        }
    }
    if (*state & NK_WIDGET_STATE_HOVER && !nk_input_is_mouse_prev_hovering_rect(i, r))
        *state |= NK_WIDGET_STATE_ENTERED;
    else if (nk_input_is_mouse_prev_hovering_rect(i, r))
        *state |= NK_WIDGET_STATE_LEFT;
    return ret;
}